

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg_st_test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  undefined4 local_80;
  undefined4 local_7c;
  MppSysCfgStSize size_cfg;
  MppSysCfgStVStrd v_stride_cfg;
  MppSysCfgStHByteStrd byte_stride_cfg;
  MppSysCfgStHStrd h_stride_cfg;
  RK_U32 height;
  RK_U32 width;
  MppCodingType type;
  MPP_RET ret;
  
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test h_stride start\n");
  byte_stride_cfg.width = 0x1000004;
  byte_stride_cfg.h_stride_by_byte = 0x100000;
  iVar1 = mpp_sys_cfg_st_get_h_stride(&byte_stride_cfg.width);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: h_stride_by_pixel(%d)",0,h_stride_cfg.width);
  pcVar2 = "success";
  if (iVar1 != 0) {
    pcVar2 = "failed";
  }
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test h_stride done %s\n",0,pcVar2);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test byte_stride start\n");
  v_stride_cfg.height = 0x1000004;
  v_stride_cfg.v_stride = 0;
  byte_stride_cfg.type = 0x100000;
  byte_stride_cfg.fmt_codec = 0x1000;
  iVar1 = mpp_sys_cfg_st_get_byte_stride(&v_stride_cfg.height);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: h_stride_by_byte(%d)",0,byte_stride_cfg.fmt_fbc);
  pcVar2 = "success";
  if (iVar1 != 0) {
    pcVar2 = "failed";
  }
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test byte_stride done %s\n",0,pcVar2);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test v_stride_cfg start\n");
  size_cfg.size_fbc_hdr = 0x1000004;
  size_cfg.size_fbc_bdy = 0x100000;
  v_stride_cfg.type = 0x900;
  iVar1 = mpp_sys_cfg_st_get_v_stride(&size_cfg.size_fbc_hdr);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: v_stride(%d)",0,v_stride_cfg.fmt_fbc);
  pcVar2 = "success";
  if (iVar1 != 0) {
    pcVar2 = "failed";
  }
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test v_stride_cfg done %s\n",0,pcVar2);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test size_cfg start\n");
  local_80 = 0x1000004;
  local_7c = 0;
  size_cfg.type = 0x100000;
  size_cfg.fmt_codec = 0x1000;
  size_cfg.fmt_fbc = 0x900;
  iVar1 = mpp_sys_cfg_st_get_size(&local_80);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: h_stride_by_pixel(%d)",0,size_cfg.h_stride_by_byte);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: h_stride_by_byte(%d)",0,size_cfg.width);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: v_stride(%d)",0,size_cfg.height);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: size_total(%d)",0,size_cfg.v_stride);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: size_fbc_hdr(%d)",0,size_cfg.h_stride_by_pixel);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: size_fbc_bdy(%d)",0,size_cfg.size_total);
  pcVar2 = "success";
  if (iVar1 != 0) {
    pcVar2 = "failed";
  }
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test size_cfg done %s\n",0,pcVar2);
  return iVar1;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    MppCodingType type = MPP_VIDEO_CodingHEVC;
    RK_U32 width = 4096;
    RK_U32 height = 2304;

    MppSysCfgStHStrd h_stride_cfg;
    MppSysCfgStHByteStrd byte_stride_cfg;
    MppSysCfgStVStrd v_stride_cfg;
    MppSysCfgStSize size_cfg;


    mpp_log("mpp_sys_cfg_st_test h_stride start\n");
    h_stride_cfg.type = type;
    h_stride_cfg.fmt_fbc = MPP_FRAME_FBC_AFBC_V1;
    h_stride_cfg.width = width;
    ret = mpp_sys_cfg_st_get_h_stride(&h_stride_cfg);
    mpp_log("mpp_sys_cfg_st_test result: h_stride_by_pixel(%d)",
            h_stride_cfg.h_stride_by_pixel);
    mpp_log("mpp_sys_cfg_st_test h_stride done %s\n", ret ? "failed" : "success");


    mpp_log("mpp_sys_cfg_st_test byte_stride start\n");
    byte_stride_cfg.type = type;
    byte_stride_cfg.fmt_codec = MPP_FMT_YUV420SP;
    byte_stride_cfg.fmt_fbc = MPP_FRAME_FBC_AFBC_V1;
    byte_stride_cfg.width = width;
    ret = mpp_sys_cfg_st_get_byte_stride(&byte_stride_cfg);
    mpp_log("mpp_sys_cfg_st_test result: h_stride_by_byte(%d)",
            byte_stride_cfg.h_stride_by_byte);
    mpp_log("mpp_sys_cfg_st_test byte_stride done %s\n", ret ? "failed" : "success");


    mpp_log("mpp_sys_cfg_st_test v_stride_cfg start\n");
    v_stride_cfg.type = type;
    v_stride_cfg.fmt_fbc = MPP_FRAME_FBC_AFBC_V1;
    v_stride_cfg.height = height;
    ret = mpp_sys_cfg_st_get_v_stride(&v_stride_cfg);
    mpp_log("mpp_sys_cfg_st_test result: v_stride(%d)",
            v_stride_cfg.v_stride);
    mpp_log("mpp_sys_cfg_st_test v_stride_cfg done %s\n", ret ? "failed" : "success");


    mpp_log("mpp_sys_cfg_st_test size_cfg start\n");
    size_cfg.type = type;
    size_cfg.fmt_codec = MPP_FMT_YUV420SP;
    size_cfg.fmt_fbc = MPP_FRAME_FBC_AFBC_V1;
    size_cfg.width = width;
    size_cfg.height = height;
    ret = mpp_sys_cfg_st_get_size(&size_cfg);
    mpp_log("mpp_sys_cfg_st_test result: h_stride_by_pixel(%d)",
            size_cfg.h_stride_by_pixel);
    mpp_log("mpp_sys_cfg_st_test result: h_stride_by_byte(%d)",
            size_cfg.h_stride_by_byte);
    mpp_log("mpp_sys_cfg_st_test result: v_stride(%d)",
            size_cfg.v_stride);
    mpp_log("mpp_sys_cfg_st_test result: size_total(%d)",
            size_cfg.size_total);
    mpp_log("mpp_sys_cfg_st_test result: size_fbc_hdr(%d)",
            size_cfg.size_fbc_hdr);
    mpp_log("mpp_sys_cfg_st_test result: size_fbc_bdy(%d)",
            size_cfg.size_fbc_bdy);
    mpp_log("mpp_sys_cfg_st_test size_cfg done %s\n", ret ? "failed" : "success");


    return ret;
}